

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_flac__on_read_ogg(void *pUserData,void *bufferOut,size_t bytesToRead)

{
  ma_bool32 mVar1;
  ulong __n;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t bytesRemainingToRead;
  size_t bytesRead;
  ma_uint8 *pRunningBufferOut;
  ma_dr_flac_oggbs *oggbs;
  ma_dr_flac_ogg_crc_mismatch_recovery in_stack_000000f4;
  ma_dr_flac_oggbs *in_stack_000000f8;
  ulong local_30;
  void *local_28;
  
  local_30 = 0;
  local_28 = in_RSI;
  while( true ) {
    if (in_RDX <= local_30) {
      return local_30;
    }
    __n = in_RDX - local_30;
    if (__n <= *(uint *)(in_RDI + 0x270)) break;
    if (*(int *)(in_RDI + 0x270) != 0) {
      memcpy(local_28,(void *)(in_RDI + 0x278 +
                              (ulong)(uint)(*(int *)(in_RDI + 0x274) - *(int *)(in_RDI + 0x270))),
             (ulong)*(uint *)(in_RDI + 0x270));
      local_30 = *(uint *)(in_RDI + 0x270) + local_30;
      local_28 = (void *)((long)local_28 + (ulong)*(uint *)(in_RDI + 0x270));
      *(undefined4 *)(in_RDI + 0x270) = 0;
    }
    mVar1 = ma_dr_flac_oggbs__goto_next_page(in_stack_000000f8,in_stack_000000f4);
    if (mVar1 == 0) {
      return local_30;
    }
  }
  memcpy(local_28,(void *)(in_RDI + 0x278 +
                          (ulong)(uint)(*(int *)(in_RDI + 0x274) - *(int *)(in_RDI + 0x270))),__n);
  *(int *)(in_RDI + 0x270) = *(int *)(in_RDI + 0x270) - (int)__n;
  return __n + local_30;
}

Assistant:

static size_t ma_dr_flac__on_read_ogg(void* pUserData, void* bufferOut, size_t bytesToRead)
{
    ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pUserData;
    ma_uint8* pRunningBufferOut = (ma_uint8*)bufferOut;
    size_t bytesRead = 0;
    MA_DR_FLAC_ASSERT(oggbs != NULL);
    MA_DR_FLAC_ASSERT(pRunningBufferOut != NULL);
    while (bytesRead < bytesToRead) {
        size_t bytesRemainingToRead = bytesToRead - bytesRead;
        if (oggbs->bytesRemainingInPage >= bytesRemainingToRead) {
            MA_DR_FLAC_COPY_MEMORY(pRunningBufferOut, oggbs->pageData + (oggbs->pageDataSize - oggbs->bytesRemainingInPage), bytesRemainingToRead);
            bytesRead += bytesRemainingToRead;
            oggbs->bytesRemainingInPage -= (ma_uint32)bytesRemainingToRead;
            break;
        }
        if (oggbs->bytesRemainingInPage > 0) {
            MA_DR_FLAC_COPY_MEMORY(pRunningBufferOut, oggbs->pageData + (oggbs->pageDataSize - oggbs->bytesRemainingInPage), oggbs->bytesRemainingInPage);
            bytesRead += oggbs->bytesRemainingInPage;
            pRunningBufferOut += oggbs->bytesRemainingInPage;
            oggbs->bytesRemainingInPage = 0;
        }
        MA_DR_FLAC_ASSERT(bytesRemainingToRead > 0);
        if (!ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_recover_on_crc_mismatch)) {
            break;
        }
    }
    return bytesRead;
}